

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::normalize_space(char_t *buffer)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbStack_20;
  char_t ch;
  char_t *it;
  char_t *write;
  char_t *buffer_local;
  
  pbStack_20 = buffer;
  it = buffer;
  while (*pbStack_20 != 0) {
    pbVar2 = pbStack_20 + 1;
    bVar1 = *pbStack_20;
    pbStack_20 = pbVar2;
    if (((anonymous_namespace)::chartype_table[bVar1] & 8) == 0) {
      *it = bVar1;
      it = it + 1;
    }
    else {
      while (((anonymous_namespace)::chartype_table[*pbStack_20] & 8) != 0) {
        pbStack_20 = pbStack_20 + 1;
      }
      if (it != buffer) {
        *it = ' ';
        it = it + 1;
      }
    }
  }
  if ((it != buffer) && (((anonymous_namespace)::chartype_table[it[-1]] & 8) != 0)) {
    it = it + -1;
  }
  *it = '\0';
  return it;
}

Assistant:

PUGI__FN char_t* normalize_space(char_t* buffer)
	{
		char_t* write = buffer;

		for (char_t* it = buffer; *it; )
		{
			char_t ch = *it++;

			if (PUGI__IS_CHARTYPE(ch, ct_space))
			{
				// replace whitespace sequence with single space
				while (PUGI__IS_CHARTYPE(*it, ct_space)) it++;

				// avoid leading spaces
				if (write != buffer) *write++ = ' ';
			}
			else *write++ = ch;
		}

		// remove trailing space
		if (write != buffer && PUGI__IS_CHARTYPE(write[-1], ct_space)) write--;

		// zero-terminate
		*write = 0;

		return write;
	}